

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,0,0,false>>
          (detail *this,basic_string_view<char> fmt,
          format_string_checker<char,_0,_0,_false> *handler)

{
  size_t *psVar1;
  detail dVar2;
  char *pcVar3;
  detail *begin;
  format_string_checker<char,_0,_0,_false> *pfVar4;
  detail *pdVar5;
  detail *end;
  id_adapter local_40;
  
  pfVar4 = (format_string_checker<char,_0,_0,_false> *)fmt.size_;
  if (fmt.data_ != (char *)0x0) {
    end = (detail *)(fmt.data_ + (long)this);
    do {
      begin = this + 1;
      if (*this == (detail)0x7d) {
        if ((begin == end) || (*begin != (detail)0x7d)) {
          report_error("unmatched \'}\' in format string");
        }
        goto LAB_00134d47;
      }
      if (*this == (detail)0x7b) {
        if (begin == end) {
          report_error("invalid format string");
        }
        dVar2 = *begin;
        if (dVar2 == (detail)0x3a) {
          compile_parse_context<char>::next_arg_id(&pfVar4->context_);
LAB_00134da6:
          pdVar5 = begin + 1;
          pcVar3 = (pfVar4->context_).super_parse_context<char>.fmt_.data_;
          (pfVar4->context_).super_parse_context<char>.fmt_.data_ = (char *)pdVar5;
          psVar1 = &(pfVar4->context_).super_parse_context<char>.fmt_.size_;
          *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)pdVar5));
          begin = pdVar5;
          for (; (pdVar5 != end && (begin = pdVar5, *pdVar5 != (detail)0x7d)); pdVar5 = pdVar5 + 1)
          {
            begin = end;
          }
          if ((begin == end) || (*begin != (detail)0x7d)) {
            report_error("unknown format specifier");
          }
LAB_00134ddb:
          begin = begin + 1;
        }
        else {
          if (dVar2 != (detail)0x7b) {
            if (dVar2 != (detail)0x7d) {
              local_40.arg_id = 0;
              local_40.handler = pfVar4;
              begin = (detail *)
                      parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_string_checker<char,0,0,false>&>(char_const*,char_const*,fmt::v11::detail::format_string_checker<char,0,0,false>&)::id_adapter&>
                                ((char *)begin,(char *)end,&local_40);
              if (begin == end) {
LAB_00134e1d:
                report_error("missing \'}\' in format string");
              }
              if (*begin == (detail)0x3a) goto LAB_00134da6;
              if (*begin != (detail)0x7d) goto LAB_00134e1d;
              pcVar3 = (pfVar4->context_).super_parse_context<char>.fmt_.data_;
              (pfVar4->context_).super_parse_context<char>.fmt_.data_ = (char *)begin;
              psVar1 = &(pfVar4->context_).super_parse_context<char>.fmt_.size_;
              *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)begin));
              goto LAB_00134ddb;
            }
            compile_parse_context<char>::next_arg_id(&pfVar4->context_);
            pcVar3 = (pfVar4->context_).super_parse_context<char>.fmt_.data_;
            (pfVar4->context_).super_parse_context<char>.fmt_.data_ = (char *)begin;
            psVar1 = &(pfVar4->context_).super_parse_context<char>.fmt_.size_;
            *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)begin));
          }
LAB_00134d47:
          begin = this + 2;
        }
      }
      this = begin;
    } while (this != end);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}